

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

char * make_signed_hex_str_16(uint val)

{
  uint val_local;
  
  if ((val & 0xffff) == 0x8000) {
    sprintf(make_signed_hex_str_16::str,"-$8000");
  }
  else if ((val & 0x8000) == 0) {
    sprintf(make_signed_hex_str_16::str,"$%x",(ulong)(val & 0x7fff));
  }
  else {
    sprintf(make_signed_hex_str_16::str,"-$%x",(ulong)(-(val & 0xffff) & 0x7fff));
  }
  return make_signed_hex_str_16::str;
}

Assistant:

static char* make_signed_hex_str_16(uint val)
{
	static char str[20];

	val &= 0xffff;

	if(val == 0x8000)
		sprintf(str, "-$8000");
	else if(val & 0x8000)
		sprintf(str, "-$%x", (0-val) & 0x7fff);
	else
		sprintf(str, "$%x", val & 0x7fff);

	return str;
}